

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

double max(DataSet *dataset)

{
  pointer pdVar1;
  double *pdVar2;
  double dVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  ulong uVar5;
  uint uVar6;
  uint index;
  ulong uVar7;
  double dVar8;
  Matrix<double> mat;
  double local_78;
  Matrix<double> local_70;
  
  DataSet::matrix(&local_70,dataset);
  if (local_70.m_shape.n_row == 0) {
    std::operator<<((ostream *)&std::cout,"ERROR [[] operator]: Index out of bound!\n");
    exit(1);
  }
  local_78 = *((local_70.m_elems.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
              _M_start;
  if (local_70.m_shape.n_row != 0) {
    index = 0;
    do {
      pvVar4 = Matrix<double>::operator[](&local_70,index);
      pdVar1 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar8 = *pdVar1;
      uVar5 = (long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
      if (1 < uVar5) {
        uVar7 = 1;
        uVar6 = 2;
        do {
          dVar3 = pdVar1[uVar7];
          if (pdVar1[uVar7] <= dVar8) {
            dVar3 = dVar8;
          }
          dVar8 = dVar3;
          uVar7 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar7 < uVar5);
      }
      if (local_78 < dVar8) {
        pvVar4 = Matrix<double>::operator[](&local_70,index);
        pdVar2 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_78 = *pdVar2;
        uVar5 = (long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
        if (1 < uVar5) {
          uVar7 = 1;
          uVar6 = 2;
          do {
            dVar8 = pdVar2[uVar7];
            if (pdVar2[uVar7] <= local_78) {
              dVar8 = local_78;
            }
            local_78 = dVar8;
            uVar7 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
          } while (uVar7 < uVar5);
        }
      }
      index = index + 1;
    } while (index < local_70.m_shape.n_row);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_70.m_elems);
  return local_78;
}

Assistant:

double max(const DataSet& dataset){
    Matrix_d mat=dataset.matrix();
    double result=mat[0][0];
    for(unsigned i=0;i<mat.shape().n_row;++i){
        if(result<max(mat[i])) result=max(mat[i]);
    }
    return result;
}